

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  pointer *this_00;
  initializer_list<cmListFileArgument> __l;
  bool bVar1;
  bool bVar2;
  string *psVar3;
  char *filename;
  cmMessenger *messenger;
  size_type sVar4;
  reference pcVar5;
  cmake *this_01;
  pointer defer;
  reference ppcVar6;
  string_view value;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  cmListFileArgument *local_8d0;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_718;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_710;
  iterator sdi;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_6e0;
  const_iterator local_6d8;
  allocator<cmListFileArgument> local_6cb;
  undefined1 local_6ca;
  allocator<char> local_6c9;
  string local_6c8;
  allocator<char> local_6a1;
  string local_6a0;
  cmListFileArgument *local_680;
  cmListFileArgument local_678;
  cmListFileArgument local_648;
  iterator local_618;
  size_type local_610;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_608;
  allocator<char> local_5e9;
  string local_5e8;
  undefined1 local_5c8 [8];
  cmListFileFunction project;
  string local_5b0;
  reference local_590;
  cmListFileFunction *func_2;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range2_1;
  bool hasProject;
  cmListFileFunction *func_1;
  iterator __end4;
  iterator __begin4;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range4;
  allocator<char> local_531;
  value_type local_530;
  _Base_ptr local_510;
  undefined1 local_508;
  allocator<char> local_4f9;
  value_type local_4f8;
  _Base_ptr local_4d8;
  undefined1 local_4d0;
  allocator<char> local_4c1;
  value_type local_4c0;
  _Base_ptr local_4a0;
  undefined1 local_498;
  allocator<char> local_489;
  value_type local_488;
  _Base_ptr local_468;
  undefined1 local_460;
  allocator<char> local_451;
  value_type local_450;
  _Base_ptr local_430;
  undefined1 local_428;
  allocator<char> local_419;
  value_type local_418;
  _Base_ptr local_3f8;
  undefined1 local_3f0;
  allocator<char> local_3e1;
  value_type local_3e0;
  _Base_ptr local_3c0;
  undefined1 local_3b8;
  allocator<char> local_3a9;
  value_type local_3a8;
  _Base_ptr local_388;
  undefined1 local_380;
  allocator<char> local_371;
  value_type local_370;
  _Base_ptr local_350;
  undefined1 local_348;
  allocator<char> local_339;
  value_type local_338;
  _Base_ptr local_318;
  undefined1 local_310;
  allocator<char> local_301;
  value_type local_300;
  undefined1 local_2e0 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowedCommands;
  bool isProblem;
  cmListFileFunction *func;
  iterator __end2;
  iterator __begin2;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range2;
  undefined1 local_280 [3];
  bool hasVersion;
  cmListFile listFile;
  allocator<char> local_251;
  string local_250;
  Status local_230;
  cmAlphaNum local_228;
  cmStateDirectory local_1f8;
  cmAlphaNum local_1d0;
  undefined1 local_1a0 [8];
  string filesDir;
  BuildsystemFileScope scope;
  cmListFileContext local_138;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_c8;
  cmAlphaNum local_b8;
  cmStateDirectory local_88;
  cmAlphaNum local_60;
  undefined1 local_30 [8];
  string currentStart;
  cmMakefile *this_local;
  
  currentStart.field_2._8_8_ = this;
  cmStateSnapshot::GetDirectory(&local_88,&this->StateSnapshot);
  psVar3 = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_88);
  cmAlphaNum::cmAlphaNum(&local_60,psVar3);
  cmAlphaNum::cmAlphaNum(&local_b8,"/CMakeLists.txt");
  cmStrCat<>((string *)local_30,&local_60,&local_b8);
  cmListFileContext::FromListFilePath(&local_138,(string *)local_30);
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            (&local_c8,(cmListFileContext *)&this->Backtrace);
  cmListFileBacktrace::operator=(&this->Backtrace,(cmListFileBacktrace *)&local_c8);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_c8);
  cmListFileContext::~cmListFileContext(&local_138);
  BuildsystemFileScope::BuildsystemFileScope
            ((BuildsystemFileScope *)((long)&filesDir.field_2 + 8),this);
  cmStateSnapshot::GetDirectory(&local_1f8,&this->StateSnapshot);
  psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_1f8);
  cmAlphaNum::cmAlphaNum(&local_1d0,psVar3);
  cmAlphaNum::cmAlphaNum(&local_228,"/CMakeFiles");
  cmStrCat<>((string *)local_1a0,&local_1d0,&local_228);
  local_230 = cmsys::SystemTools::MakeDirectory((string *)local_1a0,(mode_t *)0x0);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_30,true);
  if (!bVar1) {
    __assert_fail("cmSystemTools::FileExists(currentStart, true)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx"
                  ,0x655,"void cmMakefile::Configure()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"CMAKE_PARENT_LIST_FILE",&local_251);
  value = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
  listFile.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)value._M_len;
  AddDefinition(this,&local_250,value);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  cmListFile::cmListFile((cmListFile *)local_280);
  filename = (char *)std::__cxx11::string::c_str();
  messenger = GetMessenger(this);
  bVar1 = cmListFile::ParseFile((cmListFile *)local_280,filename,messenger,&this->Backtrace);
  if (bVar1) {
    bVar1 = IsRootMakefile(this);
    if (bVar1) {
      bVar1 = false;
      __end2 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                         ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                          local_280);
      func = (cmListFileFunction *)
             std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                       ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_280
                       );
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                         *)&func), bVar2) {
        pcVar5 = __gnu_cxx::
                 __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                 ::operator*(&__end2);
        psVar3 = cmListFileFunction::LowerCaseName_abi_cxx11_(pcVar5);
        bVar2 = std::operator==(psVar3,"cmake_minimum_required");
        if (bVar2) {
          bVar1 = true;
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
        ::operator++(&__end2);
      }
      if (!bVar1) {
        allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
        sVar4 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::size
                          ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                           local_280);
        if (sVar4 < 0x1e) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2e0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_300,"project",&local_301);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2e0,&local_300);
          local_318 = (_Base_ptr)pVar7.first._M_node;
          local_310 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_300);
          std::allocator<char>::~allocator(&local_301);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"set",&local_339);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2e0,&local_338);
          local_350 = (_Base_ptr)pVar7.first._M_node;
          local_348 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_338);
          std::allocator<char>::~allocator(&local_339);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"if",&local_371);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2e0,&local_370);
          local_388 = (_Base_ptr)pVar7.first._M_node;
          local_380 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_370);
          std::allocator<char>::~allocator(&local_371);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3a8,"endif",&local_3a9);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2e0,&local_3a8);
          local_3c0 = (_Base_ptr)pVar7.first._M_node;
          local_3b8 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_3a8);
          std::allocator<char>::~allocator(&local_3a9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"else",&local_3e1)
          ;
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2e0,&local_3e0);
          local_3f8 = (_Base_ptr)pVar7.first._M_node;
          local_3f0 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_3e0);
          std::allocator<char>::~allocator(&local_3e1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_418,"elseif",&local_419);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2e0,&local_418);
          local_430 = (_Base_ptr)pVar7.first._M_node;
          local_428 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_418);
          std::allocator<char>::~allocator(&local_419);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_450,"add_executable",&local_451);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2e0,&local_450);
          local_468 = (_Base_ptr)pVar7.first._M_node;
          local_460 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_450);
          std::allocator<char>::~allocator(&local_451);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_488,"add_library",&local_489);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2e0,&local_488);
          local_4a0 = (_Base_ptr)pVar7.first._M_node;
          local_498 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_488);
          std::allocator<char>::~allocator(&local_489);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4c0,"target_link_libraries",&local_4c1);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2e0,&local_4c0);
          local_4d8 = (_Base_ptr)pVar7.first._M_node;
          local_4d0 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_4c0);
          std::allocator<char>::~allocator(&local_4c1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4f8,"option",&local_4f9);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2e0,&local_4f8);
          local_510 = (_Base_ptr)pVar7.first._M_node;
          local_508 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_4f8);
          std::allocator<char>::~allocator(&local_4f9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_530,"message",&local_531);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2e0,&local_530);
          std::__cxx11::string::~string((string *)&local_530);
          std::allocator<char>::~allocator(&local_531);
          allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
          __end4 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                             ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                              local_280);
          func_1 = (cmListFileFunction *)
                   std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                             ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                              local_280);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                             *)&func_1), bVar1) {
            pcVar5 = __gnu_cxx::
                     __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                     ::operator*(&__end4);
            psVar3 = cmListFileFunction::LowerCaseName_abi_cxx11_(pcVar5);
            bVar1 = ::cm::
                    contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_2e0,psVar3);
            if (!bVar1) {
              allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
              break;
            }
            __gnu_cxx::
            __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
            ::operator++(&__end4);
          }
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2e0);
        }
        if ((allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
          SetCheckCMP0000(this,true);
          cmPolicies::ApplyPolicyVersion(this,2,4,0,Off);
        }
      }
      bVar1 = false;
      __end2_1 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                           ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                            local_280);
      func_2 = (cmListFileFunction *)
               std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                         ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                          local_280);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                 *)&func_2), bVar2) {
        local_590 = __gnu_cxx::
                    __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                    ::operator*(&__end2_1);
        psVar3 = cmListFileFunction::LowerCaseName_abi_cxx11_(local_590);
        bVar2 = std::operator==(psVar3,"project");
        if (bVar2) {
          bVar1 = true;
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
        ::operator++(&__end2_1);
      }
      if (!bVar1) {
        this_01 = GetCMakeInstance(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5b0,
                   "No project() command is present.  The top-level CMakeLists.txt file must contain a literal, direct call to the project() command.  Add a line of code such as\n  project(ProjectName)\nnear the top of the file, but after cmake_minimum_required().\nCMake is pretending there is a \"project(Project)\" command on the first line."
                   ,(allocator<char> *)
                    ((long)&project.Impl.
                            super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 7));
        cmake::IssueMessage(this_01,AUTHOR_WARNING,&local_5b0,&this->Backtrace);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&project.Impl.
                           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + 7));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5e8,"project",&local_5e9);
        local_6ca = 1;
        local_680 = &local_678;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6a0,"Project",&local_6a1);
        cmListFileArgument::cmListFileArgument(&local_678,&local_6a0,Unquoted,0);
        local_680 = &local_648;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6c8,"__CMAKE_INJECTED_PROJECT_COMMAND__",&local_6c9);
        cmListFileArgument::cmListFileArgument(&local_648,&local_6c8,Unquoted,0);
        local_6ca = 0;
        local_618 = &local_678;
        local_610 = 2;
        std::allocator<cmListFileArgument>::allocator(&local_6cb);
        __l._M_len = local_610;
        __l._M_array = local_618;
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
                  (&local_608,__l,&local_6cb);
        cmListFileFunction::cmListFileFunction
                  ((cmListFileFunction *)local_5c8,&local_5e8,0,0,&local_608);
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_608);
        std::allocator<cmListFileArgument>::~allocator(&local_6cb);
        local_8d0 = (cmListFileArgument *)&local_618;
        do {
          local_8d0 = local_8d0 + -1;
          cmListFileArgument::~cmListFileArgument(local_8d0);
        } while (local_8d0 != &local_678);
        std::__cxx11::string::~string((string *)&local_6c8);
        std::allocator<char>::~allocator(&local_6c9);
        std::__cxx11::string::~string((string *)&local_6a0);
        std::allocator<char>::~allocator(&local_6a1);
        std::__cxx11::string::~string((string *)&local_5e8);
        std::allocator<char>::~allocator(&local_5e9);
        local_6e0._M_current =
             (cmListFileFunction *)
             std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                       ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_280
                       );
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_const*,std::vector<cmListFileFunction,std::allocator<cmListFileFunction>>>
        ::__normal_iterator<cmListFileFunction*>
                  ((__normal_iterator<cmListFileFunction_const*,std::vector<cmListFileFunction,std::allocator<cmListFileFunction>>>
                    *)&local_6d8,&local_6e0);
        std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
                  ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_280,
                   local_6d8,(value_type *)local_5c8);
        cmListFileFunction::~cmListFileFunction((cmListFileFunction *)local_5c8);
      }
    }
    std::make_unique<cmMakefile::DeferCommands>();
    this_00 = &subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
    operator=(&this->Defer,
              (unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
               *)this_00);
    std::unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
    ~unique_ptr((unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
                 *)this_00);
    defer = std::
            unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
            get(&this->Defer);
    RunListFile(this,(cmListFile *)local_280,(string *)local_30,defer);
    std::unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
    reset(&this->Defer,(pointer)0x0);
    bVar1 = cmSystemTools::GetFatalErrorOccurred();
    if (bVar1) {
      BuildsystemFileScope::Quiet((BuildsystemFileScope *)((long)&filesDir.field_2 + 8));
    }
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
              ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi,
               &this->UnConfiguredDirectories);
    local_710._M_current =
         (cmMakefile **)
         std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::begin
                   ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
    while( true ) {
      local_718._M_current =
           (cmMakefile **)
           std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::end
                     ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
      bVar1 = __gnu_cxx::operator!=(&local_710,&local_718);
      if (!bVar1) break;
      ppcVar6 = __gnu_cxx::
                __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                ::operator*(&local_710);
      cmStateSnapshot::InitializeFromParent_ForSubdirsCommand(&(*ppcVar6)->StateSnapshot);
      ppcVar6 = __gnu_cxx::
                __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                ::operator*(&local_710);
      ConfigureSubDirectory(this,*ppcVar6);
      __gnu_cxx::
      __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>::
      operator++(&local_710);
    }
    AddCMakeDependFilesFromUser(this);
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~vector
              ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
  }
  cmListFile::~cmListFile((cmListFile *)local_280);
  std::__cxx11::string::~string((string *)local_1a0);
  BuildsystemFileScope::~BuildsystemFileScope((BuildsystemFileScope *)((long)&filesDir.field_2 + 8))
  ;
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmMakefile::Configure()
{
  std::string currentStart = cmStrCat(
    this->StateSnapshot.GetDirectory().GetCurrentSource(), "/CMakeLists.txt");

  // Add the bottom of all backtraces within this directory.
  // We will never pop this scope because it should be available
  // for messages during the generate step too.
  this->Backtrace =
    this->Backtrace.Push(cmListFileContext::FromListFilePath(currentStart));

  BuildsystemFileScope scope(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = cmStrCat(
    this->StateSnapshot.GetDirectory().GetCurrentBinary(), "/CMakeFiles");
  cmSystemTools::MakeDirectory(filesDir);

  assert(cmSystemTools::FileExists(currentStart, true));
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentStart);

  cmListFile listFile;
  if (!listFile.ParseFile(currentStart.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return;
  }
  if (this->IsRootMakefile()) {
    bool hasVersion = false;
    // search for the right policy command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.LowerCaseName() == "cmake_minimum_required") {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if (!hasVersion) {
      bool isProblem = true;
      if (listFile.Functions.size() < 30) {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for (cmListFileFunction const& func : listFile.Functions) {
          if (!cm::contains(allowedCommands, func.LowerCaseName())) {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem) {
        // Tell the top level cmMakefile to diagnose
        // this violation of CMP0000.
        this->SetCheckCMP0000(true);

        // Implicitly set the version for the user.
        cmPolicies::ApplyPolicyVersion(this, 2, 4, 0,
                                       cmPolicies::WarnCompat::Off);
      }
    }
    bool hasProject = false;
    // search for a project command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.LowerCaseName() == "project") {
        hasProject = true;
        break;
      }
    }
    // if no project command is found, add one
    if (!hasProject) {
      this->GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING,
        "No project() command is present.  The top-level CMakeLists.txt "
        "file must contain a literal, direct call to the project() command.  "
        "Add a line of code such as\n"
        "  project(ProjectName)\n"
        "near the top of the file, but after cmake_minimum_required().\n"
        "CMake is pretending there is a \"project(Project)\" command on "
        "the first line.",
        this->Backtrace);
      cmListFileFunction project{ "project",
                                  0,
                                  0,
                                  { { "Project", cmListFileArgument::Unquoted,
                                      0 },
                                    { "__CMAKE_INJECTED_PROJECT_COMMAND__",
                                      cmListFileArgument::Unquoted, 0 } } };
      listFile.Functions.insert(listFile.Functions.begin(), project);
    }
  }

  this->Defer = cm::make_unique<DeferCommands>();
  this->RunListFile(listFile, currentStart, this->Defer.get());
  this->Defer.reset();
  if (cmSystemTools::GetFatalErrorOccurred()) {
    scope.Quiet();
  }

  // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  auto sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi) {
    (*sdi)->StateSnapshot.InitializeFromParent_ForSubdirsCommand();
    this->ConfigureSubDirectory(*sdi);
  }

  this->AddCMakeDependFilesFromUser();
}